

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall
GlobOpt::CaptureValuesFromScratch
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  Type TVar1;
  GlobHashTable *pGVar2;
  ValueInfo *pVVar3;
  Sym *this_00;
  Value *val;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  StackSym *pSVar9;
  HashBucket *pHVar10;
  VarConstantValueInfo *pVVar11;
  JitArenaAllocator *allocator;
  ulong uVar13;
  BailoutConstantValue param2;
  BVUnitT<unsigned_long> local_68;
  SparseBVUnit _unit;
  int local_54;
  GlobOpt *pGStack_50;
  int intConstantValue;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  undefined1 local_40 [8];
  BailoutConstantValue constValue;
  anon_union_8_3_5e50e90d_for_u aVar12;
  
  _unit.word = (Type)bailOutConstValuesIter;
  pGStack_50 = this;
  local_48 = argsToCapture;
  BVSparse<Memory::JitArenaAllocator>::ClearAll((block->globOptData).changedSyms);
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (uVar13 = 0; pGVar2 = (block->globOptData).symToValueMap, uVar13 < pGVar2->tableSize;
      uVar13 = uVar13 + 1) {
    local_40 = (undefined1  [8])(pGVar2->table + uVar13);
    constValue._0_8_ = local_40;
    while( true ) {
      if (constValue._0_8_ == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) {
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar7 = 0;
      }
      if ((undefined1  [8])
          *(SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> **)
           constValue._0_8_ == local_40) break;
      constValue._0_8_ =
           *(SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> **)
            constValue._0_8_;
      pTVar8 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)local_40);
      pVVar3 = pTVar8->element->valueInfo;
      if ((((pVVar3->symStore != (Sym *)0x0) ||
           (bVar6 = ValueInfo::HasIntConstantValue(pVVar3,false), bVar6)) &&
          (this_00 = pTVar8->value, this_00 != (Sym *)0x0)) &&
         ((this_00->m_kind == SymKindStack &&
          (pSVar9 = Sym::AsStackSym(this_00), (pSVar9->field_0x19 & 0x20) != 0)))) {
        BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).changedSyms,this_00->m_id);
      }
    }
  }
  if (local_48 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((block->globOptData).changedSyms,local_48);
  }
  local_48 = (block->globOptData).changedSyms;
  do {
    local_48 = (BVSparse<Memory::JitArenaAllocator> *)local_48->head;
    if (local_48 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return;
    }
    TVar1 = *(Type *)&local_48->lastFoundIndex;
    local_68.word = ((Type *)&local_48->alloc)->word;
    while (local_68.word != 0) {
      lVar4 = 0;
      if (local_68.word != 0) {
        for (; (local_68.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear(&local_68,(BVIndex)lVar4);
      pHVar10 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                          ((block->globOptData).symToValueMap,TVar1 + (BVIndex)lVar4);
      pSVar9 = Sym::AsStackSym(pHVar10->value);
      val = pHVar10->element;
      pVVar3 = val->valueInfo;
      bVar6 = ValueInfo::TryGetIntConstantValue(pVVar3,&local_54,false);
      if (bVar6) {
        allocator = pGStack_50->func->m_alloc;
        uVar13 = 3;
        aVar12 = (anon_union_8_3_5e50e90d_for_u)(long)local_54;
LAB_0045be84:
        param2.u = aVar12;
        param2._0_8_ = uVar13;
        SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
        ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                  ((EditingIterator *)_unit.word,&allocator->super_ArenaAllocator,pSVar9,param2);
      }
      else {
        bVar6 = ValueInfo::IsVarConstant(pVVar3);
        if (bVar6) {
          pVVar11 = ValueInfo::AsVarConstant(pVVar3);
          BailoutConstantValue::InitVarConstValue
                    ((BailoutConstantValue *)local_40,pVVar11->varValue);
          allocator = pGStack_50->func->m_alloc;
          uVar13 = (ulong)local_40 & 0xffffffff;
          aVar12 = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
          goto LAB_0045be84;
        }
        CaptureCopyPropValue(pGStack_50,block,&pSVar9->super_Sym,val,bailOutCopySymsIter);
      }
    }
  } while( true );
}

Assistant:

void
GlobOpt::CaptureValuesFromScratch(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    Sym * sym = nullptr;
    Value * value = nullptr;
    ValueInfo * valueInfo = nullptr;

    block->globOptData.changedSyms->ClearAll();

    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, block->globOptData.symToValueMap)
    {
        value = bucket.element;
        valueInfo = value->GetValueInfo();

        if (valueInfo->GetSymStore() == nullptr && !valueInfo->HasIntConstantValue())
        {
            continue;
        }

        sym = bucket.value;
        if (sym == nullptr || !sym->IsStackSym() || !(sym->AsStackSym()->HasByteCodeRegSlot()))
        {
            continue;
        }
        block->globOptData.changedSyms->Set(sym->m_id);
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        HashBucket<Sym*, Value*> * bucket = block->globOptData.symToValueMap->GetBucket(symId);
        StackSym * stackSym = bucket->value->AsStackSym();
        value =  bucket->element;
        valueInfo = value->GetValueInfo();

        int intConstantValue;
        if (valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            BailoutConstantValue constValue;
            constValue.InitIntConstValue(intConstantValue);
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else if (valueInfo->IsVarConstant())
        {
            BailoutConstantValue constValue;
            constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else
        {
            CaptureCopyPropValue(block, stackSym, value, bailOutCopySymsIter);
        }
    }
    NEXT_BITSET_IN_SPARSEBV
}